

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testDynamicLib(void)

{
  uint uVar1;
  C *pCVar2;
  code *pcVar3;
  int __oflag;
  Printf *prn;
  bool result;
  DynamicLib dl;
  StringRef *in_stack_ffffffffffffff28;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff30;
  C *in_stack_ffffffffffffff38;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff40;
  char local_30 [39];
  byte local_9;
  DynamicLib local_8;
  
  axl::sys::DynamicLib::DynamicLib((DynamicLib *)0x10e8a4);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  uVar1 = axl::sys::DynamicLib::open(&local_8,local_30,__oflag);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10e8e2);
  local_9 = (byte)uVar1 & 1;
  if ((uVar1 & 1) == 0) {
    axl::err::getLastErrorDescription();
    pCVar2 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       (in_stack_ffffffffffffff30);
    printf("dl.load failed: %s\n",pCVar2);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10e939);
  }
  else {
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    pcVar3 = (code *)axl::sys::DynamicLib::getFunction
                               ((DynamicLib *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10e9de);
    if (pcVar3 == (code *)0x0) {
      axl::err::getLastErrorDescription();
      pCVar2 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         (in_stack_ffffffffffffff30);
      printf("dl.load failed: %s\n",pCVar2);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10ea30);
    }
    else {
      (*pcVar3)("hui govno i muravei %d\n",0x7b);
    }
  }
  axl::sys::DynamicLib::~DynamicLib((DynamicLib *)0x10eaa6);
  return;
}

Assistant:

void
testDynamicLib() {
	sys::DynamicLib dl;

	bool result = dl.open("libc.so.6");
	if (!result) {
		printf("dl.load failed: %s\n", err::getLastErrorDescription().sz());
		return;
	}

	typedef int Printf(const char*, ...);
	Printf* prn = (Printf*)dl.getFunction("printf");
	if (!prn) {
		printf("dl.load failed: %s\n", err::getLastErrorDescription().sz());
		return;
	}

	prn("hui govno i muravei %d\n", 123);
}